

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

FString __thiscall Stat_fps::GetStats(Stat_fps *this)

{
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_FStat)._vptr_FStat = (_func_int **)0x87e02c;
  FString::Format((FString *)this,
                  "frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms",
                  FrameCycles.Sec * 1000.0,WallCycles.Sec * 1000.0,PlaneCycles.Sec * 1000.0,
                  MaskedCycles.Sec * 1000.0);
  return (FString)(char *)this;
}

Assistant:

ADD_STAT (fps)
{
	FString out;
	out.Format("frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms",
		FrameCycles.TimeMS(), WallCycles.TimeMS(), PlaneCycles.TimeMS(), MaskedCycles.TimeMS());
	return out;
}